

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_base.h
# Opt level: O0

void __thiscall tvm::NodeBase::IncRef(NodeBase *this)

{
  NodeBase *this_local;
  
  LOCK();
  *(int *)this = *(int *)this + 1;
  UNLOCK();
  return;
}

Assistant:

void IncRef() {
    ref_counter_.fetch_add(1, std::memory_order_relaxed);
  }